

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

void __thiscall
cni_namespace_impl::cni_register::cni_register<cs_impl::any>
          (cni_register *this,namespace_t *ns,char *name,any *val)

{
  element_type *peVar1;
  allocator local_39;
  string local_38;
  
  peVar1 = (ns->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  cs::domain_type::add_var(peVar1->m_data,&local_38,val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cni_register(const cs::namespace_t &ns, const char *name, T &&val)
		{
			ns->add_var(name, std::forward<T>(val));
		}